

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNSym::gen_code_addr(CTPNSym *this)

{
  CTcPrsSymtab *sym;
  CTcPrsSymtab *this_00;
  CTcSymbol *pCVar1;
  long *in_RDI;
  int in_stack_ffffffffffffffdc;
  
  sym = CTcParser::get_global_symtab(G_prs);
  this_00 = (CTcPrsSymtab *)(**(code **)(*in_RDI + 0x60))();
  (**(code **)(*in_RDI + 0x68))();
  pCVar1 = CTcPrsSymtab::find_or_def_prop_explicit
                     (this_00,(char *)sym,(size_t)in_RDI,in_stack_ffffffffffffffdc);
  (*(pCVar1->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x1a])
            ();
  return;
}

Assistant:

void CTPNSym::gen_code_addr()
{
    /* 
     *   Look up our symbol in the global symbol table, then ask the
     *   resulting symbol to generate the appropriate code.  If the symbol
     *   isn't defined, assume it's a property.
     *   
     *   Note that we look only in the global symbol table, because local
     *   symbols have no address value.  So, even if the symbol is defined in
     *   the local table, ignore the local definition and look at the global
     *   definition.  
     */
    G_prs->get_global_symtab()
        ->find_or_def_prop_explicit(get_sym_text(), get_sym_text_len(),
                                    FALSE)
        ->gen_code_addr();
}